

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opmath.cpp
# Opt level: O1

int32_t op_shift_left(int32_t value,int32_t amount)

{
  int32_t iVar1;
  
  iVar1 = value;
  if ((amount != 0) && (iVar1 = 0, amount < 0x20 && value != 0)) {
    if (amount < -0x1f) {
      iVar1 = value >> 0x1f;
    }
    else {
      if (amount < 0) {
        iVar1 = op_shift_right(value,-amount);
        return iVar1;
      }
      iVar1 = value << ((byte)amount & 0x1f);
    }
  }
  return iVar1;
}

Assistant:

int32_t op_shift_left(int32_t value, int32_t amount)
{
	// Get the easy cases out of the way
	if (amount == 0)
		return value;
	if (value == 0 || amount >= 32)
		return 0;
	if (amount < -31)
		return (value < 0) ? -1 : 0;
	if (amount < 0)
		return op_shift_right(value, -amount);

	// Use unsigned to force a bitwise shift
	// Casting back is OK because the types implement two's complement behavior
	return (uint32_t)value << amount;
}